

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O2

ActionResultHolder<unsigned_char> *
testing::internal::
DownCast_<testing::internal::ActionResultHolder<unsigned_char>*,testing::internal::UntypedActionResultHolderBase>
          (UntypedActionResultHolderBase *f)

{
  long lVar1;
  bool bVar2;
  GTestLog local_c;
  
  if (f == (UntypedActionResultHolderBase *)0x0) {
    bVar2 = true;
  }
  else {
    lVar1 = __dynamic_cast(f,&UntypedActionResultHolderBase::typeinfo,
                           &ActionResultHolder<unsigned_char>::typeinfo,0);
    bVar2 = lVar1 != 0;
  }
  bVar2 = IsTrue(bVar2);
  if (!bVar2) {
    GTestLog::GTestLog(&local_c,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/cjuub[P]geemuboi/build_O2/_deps/googletest-src/googletest/include/gtest/internal/gtest-port.h"
                       ,0x5ea);
    std::operator<<((ostream *)&std::cerr,
                    "Condition f == NULL || dynamic_cast<To>(f) != NULL failed. ");
    GTestLog::~GTestLog(&local_c);
  }
  return (ActionResultHolder<unsigned_char> *)f;
}

Assistant:

inline To DownCast_(From* f) {  // so we only accept pointers
  // Ensures that To is a sub-type of From *.  This test is here only
  // for compile-time type checking, and has no overhead in an
  // optimized build at run-time, as it will be optimized away
  // completely.
  GTEST_INTENTIONAL_CONST_COND_PUSH_()
  if (false) {
  GTEST_INTENTIONAL_CONST_COND_POP_()
    const To to = NULL;
    ::testing::internal::ImplicitCast_<From*>(to);
  }

#if GTEST_HAS_RTTI
  // RTTI: debug mode only!
  GTEST_CHECK_(f == NULL || dynamic_cast<To>(f) != NULL);
#endif
  return static_cast<To>(f);
}